

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

bool __thiscall
QMimeBinaryProvider::matchSuffixTree
          (QMimeBinaryProvider *this,QMimeGlobMatchResult *result,CacheFile *cacheFile,
          int numEntries,int firstOffset,QString *fileName,qsizetype charPos,bool caseSensitiveCheck
          )

{
  uchar *puVar1;
  char16_t cVar2;
  uint uVar3;
  char16_t *pcVar4;
  bool bVar5;
  char cVar6;
  CutResult CVar7;
  int iVar8;
  ulong uVar10;
  uint numEntries_00;
  QString *this_00;
  uchar *puVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  QMimeProviderBase *pQVar15;
  char16_t cVar16;
  QMimeProviderBase **ppQVar17;
  QMimeProviderBase **ppQVar18;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QStringBuilder<char16_t,_QStringView> local_a0;
  QString local_88;
  QString local_68;
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  storage_type *psVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar13 = 0;
  if (0 < numEntries) {
    cVar2 = (fileName->d).ptr[charPos];
    iVar8 = numEntries + -1;
    puVar11 = cacheFile->data;
    do {
      uVar12 = iVar8 + uVar13 >> 1;
      lVar14 = (long)(int)(firstOffset + uVar12 * 0xc);
      cVar16 = (ushort)(byte)((uint)*(undefined4 *)(puVar11 + lVar14) >> 0x18) |
               (ushort)((uint)*(undefined4 *)(puVar11 + lVar14) >> 8) & 0xff00;
      if ((ushort)cVar16 < (ushort)cVar2) {
        uVar13 = uVar12 + 1;
      }
      else {
        if ((ushort)cVar16 <= (ushort)cVar2) {
          uVar13 = *(uint *)(puVar11 + lVar14 + 4);
          uVar12 = *(uint *)(puVar11 + lVar14 + 8);
          numEntries_00 =
               uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
          uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                   uVar12 << 0x18;
          if (charPos < 2) {
            uVar13 = 0;
          }
          else {
            bVar5 = matchSuffixTree(this,result,cacheFile,numEntries_00,uVar12,fileName,charPos + -1
                                    ,caseSensitiveCheck);
            uVar13 = (uint)bVar5;
          }
          if (((int)numEntries_00 < 1) || ((char)uVar13 != '\0')) goto LAB_004a9bb0;
          ppQVar17 = &(this->super_QMimeProviderBase).m_overrideProvider;
          uVar10 = 0;
          goto LAB_004a9c71;
        }
        iVar8 = uVar12 - 1;
      }
    } while ((int)uVar13 <= iVar8);
    uVar13 = 0;
  }
  goto LAB_004a9bb0;
LAB_004a9c71:
  do {
    lVar14 = (long)(int)uVar12 + uVar10 * 0xc;
    puVar11 = cacheFile->data;
    if (*(int *)(puVar11 + lVar14) != 0) break;
    uVar3 = *(uint *)(puVar11 + lVar14 + 4);
    ba.m_data._0_4_ =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    puVar11 = puVar11 + (int)(uint)ba.m_data;
    this_00 = (QString *)0xffffffffffffffff;
    do {
      puVar1 = puVar11 + 1 + (long)this_00;
      this_00 = (QString *)((long)&(this_00->d).d + 1);
    } while (*puVar1 != '\0');
    ba.m_size = (qsizetype)puVar11;
    ba.m_data._4_4_ = 0;
    psVar9 = (storage_type *)(ulong)(uint)ba.m_data;
    QString::fromLatin1(&local_68,this_00,ba);
    local_88.d.d = local_68.d.d;
    local_88.d.ptr = local_68.d.ptr;
    local_88.d.size = local_68.d.size;
    pQVar15 = *ppQVar17;
    ppQVar18 = ppQVar17;
    if (pQVar15 == (QMimeProviderBase *)0x0) {
      cVar6 = '\0';
    }
    else {
      do {
        iVar8 = (*pQVar15->_vptr_QMimeProviderBase[0xc])(pQVar15,&local_88);
        cVar6 = (char)iVar8;
        if (cVar6 != '\0') break;
        pQVar15 = (*ppQVar18)->m_overrideProvider;
        ppQVar18 = &(*ppQVar18)->m_overrideProvider;
      } while (pQVar15 != (QMimeProviderBase *)0x0);
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((cVar6 == '\0') &&
       (uVar3 = *(uint *)(cacheFile->data + lVar14 + 8),
       (!caseSensitiveCheck & (byte)(uVar3 >> 0x10)) == 0)) {
      ba_00.m_data = psVar9;
      ba_00.m_size = (qsizetype)puVar11;
      QString::fromLatin1(&local_68,this_00,ba_00);
      local_88.d.d = local_68.d.d;
      local_88.d.ptr = local_68.d.ptr;
      local_88.d.size = local_68.d.size;
      pcVar4 = (fileName->d).ptr;
      local_40 = charPos;
      local_48 = -1;
      CVar7 = QtPrivate::QContainerImplHelper::mid((fileName->d).size,&local_40,&local_48);
      if (CVar7 == Null) {
        local_a0.b.m_size = 0;
        local_a0.b.m_data = (char16_t *)0x0;
      }
      else {
        local_a0.b.m_data = pcVar4 + local_40;
        local_a0.b.m_size = local_48;
      }
      local_a0.a = L'*';
      QStringBuilder<char16_t,_QStringView>::convertTo<QString>(&local_68,&local_a0);
      QMimeGlobMatchResult::addMatch
                (result,&local_88,uVar3 >> 0x18,&local_68,(fileName->d).size + ~charPos);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar13 = 1;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != numEntries_00);
LAB_004a9bb0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return SUB41(uVar13,0);
}

Assistant:

bool QMimeBinaryProvider::matchSuffixTree(QMimeGlobMatchResult &result,
                                          QMimeBinaryProvider::CacheFile *cacheFile, int numEntries,
                                          int firstOffset, const QString &fileName,
                                          qsizetype charPos, bool caseSensitiveCheck)
{
    QChar fileChar = fileName[charPos];
    int min = 0;
    int max = numEntries - 1;
    while (min <= max) {
        const int mid = (min + max) / 2;
        const int off = firstOffset + 12 * mid;
        const QChar ch = char16_t(cacheFile->getUint32(off));
        if (ch < fileChar)
            min = mid + 1;
        else if (ch > fileChar)
            max = mid - 1;
        else {
            --charPos;
            int numChildren = cacheFile->getUint32(off + 4);
            int childrenOffset = cacheFile->getUint32(off + 8);
            bool success = false;
            if (charPos > 0)
                success = matchSuffixTree(result, cacheFile, numChildren, childrenOffset, fileName, charPos, caseSensitiveCheck);
            if (!success) {
                for (int i = 0; i < numChildren; ++i) {
                    const int childOff = childrenOffset + 12 * i;
                    const int mch = cacheFile->getUint32(childOff);
                    if (mch != 0)
                        break;
                    const int mimeTypeOffset = cacheFile->getUint32(childOff + 4);
                    const QLatin1StringView mimeType(cacheFile->getCharStar(mimeTypeOffset));
                    if (isMimeTypeGlobsExcluded(mimeType))
                        continue;
                    const int flagsAndWeight = cacheFile->getUint32(childOff + 8);
                    const int weight = flagsAndWeight & 0xff;
                    const bool caseSensitive = flagsAndWeight & 0x100;
                    if (caseSensitiveCheck || !caseSensitive) {
                        result.addMatch(mimeType, weight,
                                        u'*' + QStringView{ fileName }.mid(charPos + 1),
                                        fileName.size() - charPos - 2);
                        success = true;
                    }
                }
            }
            return success;
        }
    }
    return false;
}